

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Multi_Buffer.cpp
# Opt level: O2

void __thiscall Stereo_Buffer::end_frame(Stereo_Buffer *this,blip_time_t clock_count)

{
  int iVar1;
  long lVar2;
  int *piVar3;
  
  this->stereo_added = 0;
  piVar3 = (int *)&this->field_0x58;
  for (lVar2 = 0; lVar2 != 3; lVar2 = lVar2 + 1) {
    iVar1 = *piVar3;
    *piVar3 = 0;
    this->stereo_added = this->stereo_added | iVar1 << ((byte)lVar2 & 0x1f);
    Blip_Buffer::end_frame((Blip_Buffer *)(piVar3 + -0xe),clock_count);
    piVar3 = piVar3 + 0x10;
  }
  return;
}

Assistant:

void Stereo_Buffer::end_frame( blip_time_t clock_count )
{
	stereo_added = 0;
	for ( unsigned i = 0; i < buf_count; i++ )
	{
		stereo_added |= bufs [i].clear_modified() << i;
		bufs [i].end_frame( clock_count );
	}
}